

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall duckdb::LogicalType::IsFloating(LogicalType *this)

{
  return (this->id_ & ~SQLNULL) == FLOAT;
}

Assistant:

bool LogicalType::IsFloating() const {
	switch (id_) {
	case LogicalTypeId::FLOAT:
	case LogicalTypeId::DOUBLE:
		return true;
	default:
		return false;
	}
}